

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
DecPOMDPDiscrete::ExtractMADPDiscrete
          (DecPOMDPDiscrete *this,MultiAgentDecisionProcessDiscrete *madp)

{
  TransitionModelDiscrete *ptr;
  ObservationModelDiscrete *ptr_00;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  ulong uVar4;
  MultiAgentDecisionProcessDiscrete *pMVar5;
  MultiAgentDecisionProcessDiscrete *pMVar6;
  MultiAgentDecisionProcessDiscrete *in_RSI;
  long *in_RDI;
  Index o_1;
  Index id_1;
  Index o;
  Index id;
  Index s;
  MultiAgentDecisionProcess *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  uint uVar7;
  undefined8 in_stack_fffffffffffffe38;
  Index AI;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffffe40;
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [8];
  size_t in_stack_ffffffffffffff08;
  MultiAgentDecisionProcess *in_stack_ffffffffffffff10;
  uint local_dc;
  uint local_d8;
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [32];
  uint local_90;
  uint local_8c;
  string local_88 [36];
  uint local_64;
  string local_60 [48];
  string local_30 [32];
  MultiAgentDecisionProcessDiscrete *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x10))();
  MultiAgentDecisionProcess::SetNrAgents(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  MultiAgentDecisionProcess::GetName_abi_cxx11_(in_stack_fffffffffffffe28);
  MultiAgentDecisionProcess::SetName
            ((MultiAgentDecisionProcess *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (string *)in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_30);
  MultiAgentDecisionProcess::GetDescription_abi_cxx11_(in_stack_fffffffffffffe28);
  MultiAgentDecisionProcess::SetDescription
            ((MultiAgentDecisionProcess *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (string *)in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_60);
  pMVar5 = local_10;
  ptr = (TransitionModelDiscrete *)(**(code **)(*in_RDI + 0x160))();
  MultiAgentDecisionProcessDiscrete::SetTransitionModelPtr(pMVar5,ptr);
  pMVar5 = local_10;
  ptr_00 = (ObservationModelDiscrete *)(**(code **)(*in_RDI + 0x168))();
  MultiAgentDecisionProcessDiscrete::SetObservationModelPtr(pMVar5,ptr_00);
  local_64 = 0;
  while( true ) {
    uVar4 = (ulong)local_64;
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if (uVar4 == uVar1) break;
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_64);
    NamedDescribedEntity::GetName_abi_cxx11_((NamedDescribedEntity *)in_stack_fffffffffffffe28);
    MultiAgentDecisionProcessDiscrete::AddState
              ((MultiAgentDecisionProcessDiscrete *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (string *)in_stack_fffffffffffffe28);
    std::__cxx11::string::~string(local_88);
    local_64 = local_64 + 1;
  }
  (**(code **)(*in_RDI + 0x50))();
  MultiAgentDecisionProcessDiscrete::SetISD
            ((MultiAgentDecisionProcessDiscrete *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (StateDistribution *)in_stack_fffffffffffffe28);
  local_8c = 0;
  while( true ) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_8c;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (**(code **)(*in_RDI + 0x10))();
    if (this_00 == pbVar2) break;
    local_90 = 0;
    while( true ) {
      in_stack_fffffffffffffe68 = (char *)(ulong)local_90;
      pcVar3 = (char *)(**(code **)(*in_RDI + 200))(in_RDI,local_8c);
      if (in_stack_fffffffffffffe68 == pcVar3) break;
      (**(code **)(*in_RDI + 0xd8))(in_RDI,local_8c,local_90);
      NamedDescribedEntity::GetName_abi_cxx11_((NamedDescribedEntity *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe60 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      MultiAgentDecisionProcessDiscrete::AddObservation
                (in_stack_fffffffffffffe40,(Index)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (string *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (string *)in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::__cxx11::string::~string(local_b0);
      local_90 = local_90 + 1;
    }
    local_8c = local_8c + 1;
  }
  MultiAgentDecisionProcessDiscrete::ConstructJointObservations
            ((MultiAgentDecisionProcessDiscrete *)0xad9724);
  local_d8 = 0;
  while( true ) {
    uVar4 = (**(code **)(*in_RDI + 0x10))();
    if (local_d8 == uVar4) break;
    local_dc = 0;
    while( true ) {
      pMVar5 = (MultiAgentDecisionProcessDiscrete *)(ulong)local_dc;
      pMVar6 = (MultiAgentDecisionProcessDiscrete *)(**(code **)(*in_RDI + 0x68))(in_RDI,local_d8);
      if (pMVar5 == pMVar6) break;
      pMVar6 = local_10;
      uVar7 = local_d8;
      (**(code **)(*in_RDI + 0x80))(in_RDI,local_d8,local_dc);
      NamedDescribedEntity::GetName_abi_cxx11_((NamedDescribedEntity *)pMVar6);
      AI = (Index)((ulong)&local_121 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      MultiAgentDecisionProcessDiscrete::AddAction
                (pMVar5,AI,(string *)CONCAT44(uVar7,in_stack_fffffffffffffe30),(string *)pMVar6);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
      std::__cxx11::string::~string(local_100);
      local_dc = local_dc + 1;
    }
    local_d8 = local_d8 + 1;
  }
  MultiAgentDecisionProcessDiscrete::ConstructJointActions
            ((MultiAgentDecisionProcessDiscrete *)0xad98da);
  MultiAgentDecisionProcessDiscrete::Initialize((MultiAgentDecisionProcessDiscrete *)0xad98e7);
  return;
}

Assistant:

void
DecPOMDPDiscrete::ExtractMADPDiscrete(MultiAgentDecisionProcessDiscrete *madp)
{
    madp->SetNrAgents(GetNrAgents());
    madp->SetName(GetName());
    madp->SetDescription(GetDescription());

    // transition model
    madp->SetTransitionModelPtr(
        const_cast<TransitionModelDiscrete*>(GetTransitionModelDiscretePtr()));

    // observation model
    madp->SetObservationModelPtr(
        const_cast<ObservationModelDiscrete*>(GetObservationModelDiscretePtr()));

    // MADPComponentDiscreteStates
    for(Index s=0;s!=GetNrStates();++s)
        madp->AddState(GetState(s)->GetName());

    madp->SetISD(GetISD());

    // MADPComponentDiscreteObservations
    for(Index id=0;id!=GetNrAgents();++id)
        for(Index o=0;o!=GetNrObservations(id);++o)
            madp->AddObservation(id,GetObservation(id,o)->GetName());
    madp->ConstructJointObservations();

    // MADPComponentDiscreteActions
    for(Index id=0;id!=GetNrAgents();++id)
        for(Index o=0;o!=GetNrActions(id);++o)
            madp->AddAction(id,GetAction(id,o)->GetName());
    madp->ConstructJointActions();

    madp->Initialize();
}